

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O3

iter_type __thiscall
booster::locale::util::base_num_format<char>::format_time
          (base_num_format<char> *this,iter_type out,ios_base *ios,char_type fill,time_t time,
          string_type *format)

{
  pointer pcVar1;
  int iVar2;
  ios_info *this_00;
  time_put *ptVar3;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  streambuf_type *psVar7;
  long lVar8;
  streamsize n;
  long lVar9;
  iter_type iVar10;
  locale local_248;
  time_t time_local;
  string_type str;
  vector<char,_std::allocator<char>_> tmp_buf;
  string tz;
  tm tm;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> tmp_out;
  ios_base local_138 [120];
  long alStack_c0 [18];
  
  psVar7 = out._M_sbuf;
  uVar6 = out._8_4_;
  time_local = time;
  this_00 = ios_info::get(ios);
  ios_info::time_zone_abi_cxx11_(&tz,this_00);
  std::vector<char,std::allocator<char>>::vector<char_const*,void>
            ((vector<char,std::allocator<char>> *)&tmp_buf,tz._M_dataplus._M_p,
             tz._M_dataplus._M_p + tz._M_string_length + 1,(allocator_type *)&tmp_out);
  if (tz._M_string_length == 0) {
    localtime_r(&time_local,(tm *)&tm);
  }
  else {
    iVar2 = parse_tz(&tz);
    time_local = time_local + iVar2;
    gmtime_r(&time_local,(tm *)&tm);
    if (iVar2 != 0) {
      tm.tm_zone = tmp_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      tm.tm_gmtoff = (long)iVar2;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_out);
  std::locale::locale((locale *)&str,(locale *)(ios + 0xd0));
  ptVar3 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     ((locale *)&str);
  lVar9 = *(long *)((long)alStack_c0 + *(long *)(_tmp_out + -0x18));
  pcVar1 = (format->_M_dataplus)._M_p;
  std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
            (ptVar3,lVar9,lVar9 == 0,&tmp_out + *(long *)(_tmp_out + -0x18),(int)fill,&tm,pcVar1,
             pcVar1 + format->_M_string_length);
  std::locale::~locale((locale *)&str);
  std::__cxx11::stringbuf::str();
  std::locale::locale(&local_248,(locale *)(ios + 0xd0));
  sVar4 = formatting_size_traits<char>::size(&str,&local_248);
  std::locale::~locale(&local_248);
  lVar9 = *(long *)(ios + 0x10) - sVar4;
  if (lVar9 == 0 || *(long *)(ios + 0x10) < (long)sVar4) {
    lVar8 = 0;
  }
  else {
    lVar5 = 0;
    if ((*(uint *)(ios + 0x18) & 0xb0) != 0x20) {
      lVar5 = lVar9;
    }
    lVar8 = lVar9 - lVar5;
    if (0 < lVar5) {
      lVar9 = lVar9 + 1;
      do {
        if ((uVar6 & 1) == 0) {
          if (*(char_type **)(psVar7 + 0x28) < *(char_type **)(psVar7 + 0x30)) {
            **(char_type **)(psVar7 + 0x28) = fill;
            *(long *)(psVar7 + 0x28) = *(long *)(psVar7 + 0x28) + 1;
          }
          else {
            iVar2 = (**(code **)(*(long *)psVar7 + 0x68))(psVar7,fill);
            uVar6 = uVar6 & 0xff;
            if (iVar2 == -1) {
              uVar6 = 1;
            }
          }
        }
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
    }
  }
  if ((0 < (long)str._M_string_length) && ((uVar6 & 1) == 0)) {
    (**(code **)(*(long *)psVar7 + 0x60))(psVar7,str._M_dataplus._M_p);
  }
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    do {
      if ((uVar6 & 1) == 0) {
        if (*(char_type **)(psVar7 + 0x28) < *(char_type **)(psVar7 + 0x30)) {
          **(char_type **)(psVar7 + 0x28) = fill;
          *(long *)(psVar7 + 0x28) = *(long *)(psVar7 + 0x28) + 1;
        }
        else {
          iVar2 = (**(code **)(*(long *)psVar7 + 0x68))(psVar7,fill);
          uVar6 = uVar6 & 0xff;
          if (iVar2 == -1) {
            uVar6 = 1;
          }
        }
      }
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  *(undefined8 *)(ios + 0x10) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp_out);
  std::ios_base::~ios_base(local_138);
  if (tmp_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(tmp_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tz._M_dataplus._M_p != &tz.field_2) {
    operator_delete(tz._M_dataplus._M_p);
  }
  iVar10._8_4_ = uVar6;
  iVar10._M_sbuf = psVar7;
  iVar10._12_4_ = 0;
  return iVar10;
}

Assistant:

iter_type format_time(iter_type out,std::ios_base &ios,char_type fill,std::time_t time,string_type const &format) const
    {
        std::string tz = ios_info::get(ios).time_zone();
        std::tm tm;
        #if defined(__linux) || defined(__FreeBSD__) || defined(__APPLE__) 
        std::vector<char> tmp_buf(tz.c_str(),tz.c_str()+tz.size()+1);
        #endif
        if(tz.empty()) {
            #ifdef BOOSTER_WIN_NATIVE
            /// Windows uses TLS
            tm = *localtime(&time);
            #else
            localtime_r(&time,&tm);
            #endif
        }
        else  {
            int gmtoff = parse_tz(tz);
            time+=gmtoff;
            #ifdef BOOSTER_WIN_NATIVE
            /// Windows uses TLS
            tm = *gmtime(&time);
            #else
            gmtime_r(&time,&tm);
            #endif
            
            #if defined(__linux) || defined(__FreeBSD__) || defined(__APPLE__) 
            // These have extra fields to specify timezone
            if(gmtoff!=0) {
                // bsd and apple want tm_zone be non-const
                tm.tm_zone=&tmp_buf.front();
                tm.tm_gmtoff = gmtoff;
            }
            #endif
        }
        std::basic_ostringstream<char_type> tmp_out;
        std::use_facet<std::time_put<char_type> >(ios.getloc()).put(tmp_out,tmp_out,fill,&tm,format.c_str(),format.c_str()+format.size());
        string_type str = tmp_out.str();
        std::streamsize on_left=0,on_right = 0;
        std::streamsize points = 
            formatting_size_traits<char_type>::size(str,ios.getloc());
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // we do not really know internal point, so we assume that it does not
            // exist. so according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;
    }